

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  bool bVar1;
  int iVar2;
  AlphaNum *in_R8;
  byte local_191;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  undefined4 local_fc;
  undefined1 local_f8 [8];
  string delimiter;
  AlphaNum local_c8;
  AlphaNum local_98;
  AlphaNum local_68;
  string local_38;
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  iVar2 = this->recursion_limit_ + -1;
  this->recursion_limit_ = iVar2;
  local_18 = this;
  if (iVar2 < 0) {
    strings::AlphaNum::AlphaNum
              (&local_68,
               "Message is too deep, the parser exceeded the configured recursion limit of ");
    strings::AlphaNum::AlphaNum(&local_98,this->initial_recursion_limit_);
    strings::AlphaNum::AlphaNum(&local_c8,".");
    StrCat_abi_cxx11_(&local_38,(protobuf *)&local_68,&local_98,&local_c8,in_R8);
    ReportError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)local_f8);
    bVar1 = ConsumeMessageDelimiter(this,(string *)local_f8);
    if (bVar1) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_120,">",&local_121);
        bVar1 = LookingAt(this,&local_120);
        local_191 = 0;
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_148,"}",&local_149);
          bVar1 = LookingAt(this,&local_148);
          local_191 = bVar1 ^ 0xff;
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
        }
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        if ((local_191 & 1) == 0) {
          bVar1 = Consume(this,(string *)local_f8);
          if (bVar1) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
          goto LAB_007272ed;
        }
        bVar1 = SkipField(this);
      } while (bVar1);
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 0;
    }
LAB_007272ed:
    local_fc = 1;
    std::__cxx11::string::~string((string *)local_f8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }